

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::save_pfm_file(ConstPtr *image,string *filename)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ImageBase *pIVar5;
  invalid_argument *piVar6;
  char *pcVar7;
  FileException *this;
  int *piVar8;
  ostream *poVar9;
  element_type *peVar10;
  undefined4 extraout_var;
  ulong uVar11;
  TypedImageBase<float> *this_00;
  float *pfVar12;
  int local_284;
  long lStack_280;
  int y;
  char *ptr;
  size_t row_size;
  ofstream out;
  allocator local_69;
  string local_68 [8];
  string scale;
  string local_48 [8];
  string magic_number;
  string *filename_local;
  ConstPtr *image_local;
  
  bVar1 = std::operator==(image,(nullptr_t)0x0);
  if (bVar1) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Null image given");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string(local_48);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)image);
  iVar3 = ImageBase::channels(pIVar5);
  if (iVar3 == 1) {
    std::__cxx11::string::operator=(local_48,"Pf");
  }
  else {
    pIVar5 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar3 = ImageBase::channels(pIVar5);
    if (iVar3 != 3) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar6,"Supports 1 and 3 channel images only");
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::string::operator=(local_48,"PF");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"-1.0",&local_69);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(&row_size,pcVar7,_S_bin);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) == 0) {
    this = (FileException *)__cxa_allocate_exception(0x48);
    piVar8 = __errno_location();
    pcVar7 = strerror(*piVar8);
    util::FileException::FileException(this,filename,pcVar7);
    __cxa_throw(this,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  poVar9 = std::operator<<((ostream *)&row_size,local_48);
  std::operator<<(poVar9,anon_var_dwarf_2ef18 + 10);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)image);
  iVar3 = ImageBase::width(pIVar5);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&row_size,iVar3);
  poVar9 = std::operator<<(poVar9," ");
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)image);
  iVar3 = ImageBase::height(pIVar5);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar3);
  poVar9 = std::operator<<(poVar9," ");
  poVar9 = std::operator<<(poVar9,local_68);
  std::operator<<(poVar9,anon_var_dwarf_2ef18 + 10);
  peVar10 = std::
            __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)image);
  iVar3 = (*(peVar10->super_TypedImageBase<float>).super_ImageBase._vptr_ImageBase[3])();
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)image);
  iVar4 = ImageBase::height(pIVar5);
  uVar11 = CONCAT44(extraout_var,iVar3) / (ulong)(long)iVar4;
  this_00 = &std::
             __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image)->super_TypedImageBase<float>;
  pfVar12 = TypedImageBase<float>::end(this_00);
  lStack_280 = (long)pfVar12 - uVar11;
  local_284 = 0;
  while( true ) {
    pIVar5 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar3 = ImageBase::height(pIVar5);
    if (iVar3 <= local_284) break;
    std::ostream::write((char *)&row_size,lStack_280);
    local_284 = local_284 + 1;
    lStack_280 = lStack_280 - uVar11;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&row_size);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void
save_pfm_file (FloatImage::ConstPtr image, std::string const& filename)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    std::string magic_number;
    if (image->channels() == 1)
        magic_number = "Pf";
    else if (image->channels() == 3)
        magic_number = "PF";
    else
        throw std::invalid_argument("Supports 1 and 3 channel images only");

#ifdef HOST_BYTEORDER_LE
    std::string scale = "-1.0"; // we currently don't support scales
#else
    std::string scale = "1.0"; // we currently don't support scales
#endif

    std::ofstream out(filename.c_str(), std::ios::binary);
    if (!out.good())
        throw util::FileException(filename, std::strerror(errno));

    out << magic_number << "\n";
    out << image->width() << " " << image->height() << " " << scale << "\n";

    /* Output rows in reverse order according to PFM specification. */
    std::size_t row_size = image->get_byte_size() / image->height();
    char const* ptr = reinterpret_cast<char const*>(image->end()) - row_size;
    for (int y = 0; y < image->height(); ++y, ptr -= row_size)
        out.write(ptr, row_size);
    out.close();
}